

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O0

Offset<Movie> CreateMovie(FlatBufferBuilder *_fbb,MovieT *_o,rehasher_function_t *_rehasher)

{
  Character main_character_type;
  Offset<void> main_character;
  Offset<Movie> OVar1;
  size_type_conflict sVar2;
  Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_> local_54 [2];
  Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_> _characters;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> _characters_type;
  Offset<void> _main_character;
  Character _main_character_type;
  _VectorArgs _va;
  rehasher_function_t *_rehasher_local;
  MovieT *_o_local;
  FlatBufferBuilder *_fbb_local;
  
  main_character_type = (_o->main_character).type;
  __main_character = _fbb;
  main_character = CharacterUnion::Pack(&_o->main_character,_fbb,(rehasher_function_t *)0x0);
  sVar2 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::size(&_o->characters);
  if (sVar2 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> *)&_characters,0);
  }
  else {
    sVar2 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::size(&_o->characters);
    _characters.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<unsigned_char,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_1_,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,sVar2,&_main_character);
  }
  sVar2 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::size(&_o->characters);
  if (sVar2 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_>::Offset
              (local_54,0);
  }
  else {
    sVar2 = std::vector<CharacterUnion,_std::allocator<CharacterUnion>_>::size(&_o->characters);
    local_54[0] = flatbuffers::FlatBufferBuilderImpl<false>::
                  CreateVector<flatbuffers::Offset<void>,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_2_,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                            (_fbb,sVar2,&_main_character);
  }
  OVar1 = CreateMovie(_fbb,main_character_type,main_character,_characters.o,local_54[0]);
  return (Offset<Movie>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Movie> CreateMovie(::flatbuffers::FlatBufferBuilder &_fbb, const MovieT *_o, const ::flatbuffers::rehasher_function_t *_rehasher) {
  (void)_rehasher;
  (void)_o;
  struct _VectorArgs { ::flatbuffers::FlatBufferBuilder *__fbb; const MovieT* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;
  auto _main_character_type = _o->main_character.type;
  auto _main_character = _o->main_character.Pack(_fbb);
  auto _characters_type = _o->characters.size() ? _fbb.CreateVector<uint8_t>(_o->characters.size(), [](size_t i, _VectorArgs *__va) { return static_cast<uint8_t>(__va->__o->characters[i].type); }, &_va) : 0;
  auto _characters = _o->characters.size() ? _fbb.CreateVector<::flatbuffers::Offset<void>>(_o->characters.size(), [](size_t i, _VectorArgs *__va) { return __va->__o->characters[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va) : 0;
  return CreateMovie(
      _fbb,
      _main_character_type,
      _main_character,
      _characters_type,
      _characters);
}